

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O3

type __thiscall
nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
          (optional<tinyusdz::Relationship> *this,optional<tinyusdz::Relationship> *other)

{
  undefined8 uVar1;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_28;
  
  if (this->has_value_ == true) {
    if (other->has_value_ == false) {
      reset(this);
    }
    else {
      *(undefined4 *)&this->contained = *(undefined4 *)&other->contained;
      tinyusdz::Path::operator=
                ((Path *)((long)&this->contained + 8),(Path *)((long)&other->contained + 8));
      local_28.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = *(pointer *)((long)&this->contained + 0xe8);
      uVar1 = *(undefined8 *)((long)&other->contained + 0xe0);
      local_28.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start = *(pointer *)((long)&this->contained + 0xd8);
      local_28.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish = *(pointer *)((long)&this->contained + 0xe0);
      *(undefined8 *)((long)&this->contained + 0xd8) =
           *(undefined8 *)((long)&other->contained + 0xd8);
      *(undefined8 *)((long)&this->contained + 0xe0) = uVar1;
      *(undefined8 *)((long)&this->contained + 0xe8) =
           *(undefined8 *)((long)&other->contained + 0xe8);
      *(undefined8 *)((long)&other->contained + 0xd8) = 0;
      *(undefined8 *)((long)&other->contained + 0xe0) = 0;
      *(undefined8 *)((long)&other->contained + 0xe8) = 0;
      std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&local_28);
      *(undefined4 *)((long)&this->contained + 0xf0) =
           *(undefined4 *)((long)&other->contained + 0xf0);
      tinyusdz::AttrMetas::operator=
                ((AttrMetas *)((long)&this->contained + 0xf8),
                 (AttrMetas *)((long)&other->contained + 0xf8));
      *(undefined1 *)((long)&this->contained + 0x300) =
           *(undefined1 *)((long)&other->contained + 0x300);
    }
  }
  else if (other->has_value_ != false) {
    initialize<tinyusdz::Relationship>(this,(Relationship *)&other->contained);
  }
  return this;
}

Assistant:

operator=( optional && other ) noexcept
    {
        if      ( (has_value() == true ) && (other.has_value() == false) ) { reset(); }
        else if ( (has_value() == false) && (other.has_value() == true ) ) { initialize( std::move( *other ) ); }
        else if ( (has_value() == true ) && (other.has_value() == true ) ) { contained.value() = std::move( *other ); }
        return *this;
    }